

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O3

void pztopology::TPZTetrahedron::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_d0;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  local_50;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_40;
  
  pFVar5 = loc->fStore;
  local_90.val_ = pFVar5->val_;
  uVar1 = (pFVar5->dx_).num_elts;
  local_90.dx_.ptr_to_data = (double *)0x0;
  pFVar4 = pFVar5;
  local_90.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = (long)(int)uVar1 << 3;
    }
    local_90.dx_.ptr_to_data = (double *)operator_new__(uVar3);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_90.dx_.ptr_to_data,(EVP_PKEY_CTX *)(pFVar5->dx_).ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar4 = loc->fStore;
  }
  local_90.defaultVal = pFVar5->defaultVal;
  local_b0.val_ = pFVar4[1].val_;
  uVar1 = pFVar4[1].dx_.num_elts;
  local_b0.dx_.ptr_to_data = (double *)0x0;
  pFVar5 = pFVar4;
  local_b0.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = (long)(int)uVar1 * 8;
    }
    local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar3);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar4[1].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar5 = loc->fStore;
  }
  local_b0.defaultVal = pFVar4[1].defaultVal;
  local_70.val_ = pFVar5[2].val_;
  uVar1 = pFVar5[2].dx_.num_elts;
  local_70.dx_.ptr_to_data = (double *)0x0;
  local_70.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = (long)(int)uVar1 * 8;
    }
    local_70.dx_.ptr_to_data = (double *)operator_new__(uVar3);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_70.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar5[2].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_70.defaultVal = pFVar5[2].defaultVal;
  local_50.fadexpr_.right_ = &local_70;
  local_40.fadexpr_.left_ = &local_d0;
  local_d0.fadexpr_.left_.constant_ = 1.0;
  local_d0.fadexpr_.left_.defaultVal = 0.0;
  local_d0.fadexpr_.right_ = &local_90;
  local_50.fadexpr_.left_ = &local_40;
  local_40.fadexpr_.right_ = &local_b0;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(phi->fElem,&local_50);
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar5 = phi->fElem;
  pFVar5[1].val_ = local_90.val_;
  Vector<double>::operator=(&pFVar5[1].dx_,&local_90.dx_);
  pFVar5[1].defaultVal = local_90.defaultVal;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar5 = phi->fElem;
  pFVar5[2].val_ = local_b0.val_;
  Vector<double>::operator=(&pFVar5[2].dx_,&local_b0.dx_);
  pFVar5[2].defaultVal = local_b0.defaultVal;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar5 = phi->fElem;
  pFVar5[3].val_ = local_70.val_;
  Vector<double>::operator=(&pFVar5[3].dx_,&local_70.dx_);
  pFVar5[3].defaultVal = local_70.defaultVal;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar5 = dphi->fElem;
  pFVar5->val_ = -1.0;
  if ((pFVar5->dx_).num_elts != 0) {
    local_d0._0_8_ = 0;
    Vector<double>::operator=(&pFVar5->dx_,(double *)&local_d0);
  }
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar5 = dphi->fElem;
  pFVar5[1].val_ = -1.0;
  if (pFVar5[1].dx_.num_elts != 0) {
    local_d0._0_8_ = 0;
    Vector<double>::operator=(&pFVar5[1].dx_,(double *)&local_d0);
  }
  if ((2 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
     (0 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    pFVar5 = dphi->fElem;
    pFVar5[2].val_ = -1.0;
    if (pFVar5[2].dx_.num_elts != 0) {
      local_d0._0_8_ = 0;
      Vector<double>::operator=(&pFVar5[2].dx_,(double *)&local_d0);
    }
    lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar5 = dphi->fElem;
    pFVar5[lVar2].val_ = 1.0;
    if (pFVar5[lVar2].dx_.num_elts != 0) {
      local_d0._0_8_ = 0;
      Vector<double>::operator=(&pFVar5[lVar2].dx_,(double *)&local_d0);
      lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar5 = dphi->fElem;
    pFVar5[lVar2 + 1].val_ = 0.0;
    if (pFVar5[lVar2 + 1].dx_.num_elts != 0) {
      local_d0._0_8_ = 0;
      Vector<double>::operator=(&pFVar5[lVar2 + 1].dx_,(double *)&local_d0);
      lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar5 = dphi->fElem;
    pFVar5[lVar2 + 2].val_ = 0.0;
    if (pFVar5[lVar2 + 2].dx_.num_elts != 0) {
      local_d0._0_8_ = 0;
      Vector<double>::operator=(&pFVar5[lVar2 + 2].dx_,(double *)&local_d0);
      lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar5 = dphi->fElem;
    pFVar5[lVar2 * 2].val_ = 0.0;
    if (pFVar5[lVar2 * 2].dx_.num_elts != 0) {
      local_d0._0_8_ = 0;
      Vector<double>::operator=(&pFVar5[lVar2 * 2].dx_,(double *)&local_d0);
      lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((1 < lVar2) && (2 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
      pFVar5 = dphi->fElem;
      pFVar5[lVar2 * 2 + 1].val_ = 1.0;
      if (pFVar5[lVar2 * 2 + 1].dx_.num_elts != 0) {
        local_d0._0_8_ = 0;
        Vector<double>::operator=(&pFVar5[lVar2 * 2 + 1].dx_,(double *)&local_d0);
        lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      }
      if ((lVar2 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar5 = dphi->fElem;
      pFVar5[lVar2 * 2 + 2].val_ = 0.0;
      if (pFVar5[lVar2 * 2 + 2].dx_.num_elts != 0) {
        local_d0._0_8_ = 0;
        Vector<double>::operator=(&pFVar5[lVar2 * 2 + 2].dx_,(double *)&local_d0);
        lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      }
      if ((0 < lVar2) && (3 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
        pFVar5 = dphi->fElem;
        pFVar5[lVar2 * 3].val_ = 0.0;
        if (pFVar5[lVar2 * 3].dx_.num_elts != 0) {
          local_d0._0_8_ = 0;
          Vector<double>::operator=(&pFVar5[lVar2 * 3].dx_,(double *)&local_d0);
          lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        }
        if ((1 < lVar2) && (3 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
          pFVar5 = dphi->fElem;
          pFVar5[lVar2 * 3 + 1].val_ = 0.0;
          if (pFVar5[lVar2 * 3 + 1].dx_.num_elts != 0) {
            local_d0._0_8_ = 0;
            Vector<double>::operator=(&pFVar5[lVar2 * 3 + 1].dx_,(double *)&local_d0);
            lVar2 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          }
          if ((2 < lVar2) && (3 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
            pFVar5 = dphi->fElem;
            pFVar5[lVar2 * 3 + 2].val_ = 1.0;
            if (pFVar5[lVar2 * 3 + 2].dx_.num_elts != 0) {
              local_d0._0_8_ = 0;
              Vector<double>::operator=(&pFVar5[lVar2 * 3 + 2].dx_,(double *)&local_d0);
            }
            if ((MEM_CPY<double> *)local_70.dx_.ptr_to_data != (MEM_CPY<double> *)0x0) {
              operator_delete__(local_70.dx_.ptr_to_data);
            }
            if ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data != (MEM_CPY<double> *)0x0) {
              operator_delete__(local_b0.dx_.ptr_to_data);
            }
            if ((MEM_CPY<double> *)local_90.dx_.ptr_to_data != (MEM_CPY<double> *)0x0) {
              operator_delete__(local_90.dx_.ptr_to_data);
            }
            return;
          }
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZTetrahedron::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = 1.0-qsi-eta-zeta;
        phi(1,0)  = qsi;
        phi(2,0)  = eta;
        phi(3,0)  = zeta;

        dphi(0,0) = -1.0;
        dphi(1,0) = -1.0;
        dphi(2,0) = -1.0;
        dphi(0,1) =  1.0;
        dphi(1,1) =  0.0;
        dphi(2,1) =  0.0;
        dphi(0,2) =  0.0;
        dphi(1,2) =  1.0;
        dphi(2,2) =  0.0;
        dphi(0,3) =  0.0;
        dphi(1,3) =  0.0;
        dphi(2,3) =  1.0;

    }